

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luac.c
# Opt level: O2

void PrintFunction(Proto *f,int full)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  Instruction *pIVar5;
  LocVar *pLVar6;
  Upvaldesc *pUVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  TString *pTVar12;
  char *pcVar13;
  char *pcVar14;
  ulong uVar15;
  uint i;
  int iVar16;
  uint uVar17;
  char *pcVar18;
  char *pcVar19;
  char *pcVar20;
  long lVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  bool bVar26;
  
  pTVar12 = (TString *)"=?";
  if (f->source != (TString *)0x0) {
    pTVar12 = f->source + 1;
  }
  cVar1 = *(char *)&pTVar12->next;
  if (cVar1 == '\x1b') {
    pcVar13 = "(bstring)";
  }
  else if ((cVar1 == '@') || (cVar1 == '=')) {
    pcVar13 = (char *)((long)&pTVar12->next + 1);
  }
  else {
    pcVar13 = "(string)";
  }
  uVar3 = f->sizep;
  pcVar18 = "function";
  if (f->linedefined == 0) {
    pcVar18 = "main";
  }
  pcVar14 = "s";
  pcVar19 = "s";
  if (f->sizecode == 1) {
    pcVar19 = "";
  }
  printf("\n%s <%s:%d,%d> (%d instruction%s at %p)\n",pcVar18,pcVar13,(ulong)(uint)f->linedefined,
         (ulong)(uint)f->lastlinedefined,(ulong)(uint)f->sizecode,pcVar19,f);
  pcVar13 = "+";
  if (f->is_vararg == '\0') {
    pcVar13 = "";
  }
  pcVar18 = "s";
  if (f->numparams == 1) {
    pcVar18 = "";
  }
  pcVar19 = "s";
  if (f->maxstacksize == 1) {
    pcVar19 = "";
  }
  pcVar20 = "s";
  if (f->sizeupvalues == 1) {
    pcVar20 = "";
  }
  printf("%d%s param%s, %d slot%s, %d upvalue%s, ",(ulong)f->numparams,pcVar13,pcVar18,
         (ulong)f->maxstacksize,pcVar19,(ulong)(uint)f->sizeupvalues,pcVar20);
  pcVar13 = "s";
  if (f->sizelocvars == 1) {
    pcVar13 = "";
  }
  pcVar18 = "s";
  if (f->sizek == 1) {
    pcVar18 = "";
  }
  if (f->sizep == 1) {
    pcVar14 = "";
  }
  printf("%d local%s, %d constant%s, %d function%s\n",(ulong)(uint)f->sizelocvars,pcVar13,
         (ulong)(uint)f->sizek,pcVar18,(ulong)(uint)f->sizep,pcVar14,pcVar20);
  pIVar5 = f->code;
  iVar4 = f->sizecode;
  iVar11 = 0;
  do {
    if (iVar4 <= iVar11) {
      if (full != 0) {
        uVar10 = f->sizek;
        printf("constants (%d) for %p:\n",(ulong)uVar10,f);
        if ((int)uVar10 < 1) {
          uVar10 = 0;
        }
        uVar24 = 0;
        while (bVar26 = uVar10 != 0, uVar10 = uVar10 - 1, bVar26) {
          printf("\t%d\t",(ulong)(uVar24 + 1));
          PrintConstant(f,uVar24);
          putchar(10);
          uVar24 = uVar24 + 1;
        }
        uVar10 = f->sizelocvars;
        printf("locals (%d) for %p:\n",(ulong)uVar10,f);
        uVar15 = (ulong)uVar10;
        if ((int)uVar10 < 1) {
          uVar15 = 0;
        }
        lVar21 = 0xc;
        for (uVar25 = 0; uVar15 != uVar25; uVar25 = uVar25 + 1) {
          pLVar6 = f->locvars;
          printf("\t%d\t%s\t%d\t%d\n",uVar25 & 0xffffffff,
                 *(long *)((long)pLVar6 + lVar21 + -0xc) + 0x18,
                 (ulong)(*(int *)((long)pLVar6 + lVar21 + -4) + 1),
                 (ulong)(*(int *)((long)&pLVar6->varname + lVar21) + 1));
          lVar21 = lVar21 + 0x10;
        }
        uVar10 = f->sizeupvalues;
        printf("upvalues (%d) for %p:\n",(ulong)uVar10,f);
        uVar15 = (ulong)uVar10;
        if ((int)uVar10 < 1) {
          uVar15 = 0;
        }
        lVar21 = 9;
        for (uVar25 = 0; uVar15 != uVar25; uVar25 = uVar25 + 1) {
          pUVar7 = f->upvalues;
          lVar8 = *(long *)((long)pUVar7 + lVar21 + -9);
          pcVar13 = (char *)(lVar8 + 0x18);
          if (lVar8 == 0) {
            pcVar13 = "-";
          }
          printf("\t%d\t%s\t%d\t%d\n",uVar25 & 0xffffffff,pcVar13,
                 (ulong)*(byte *)((long)pUVar7 + lVar21 + -1),
                 (ulong)*(byte *)((long)&pUVar7->name + lVar21));
          lVar21 = lVar21 + 0x10;
        }
      }
      uVar25 = 0;
      uVar15 = (ulong)uVar3;
      if ((int)uVar3 < 1) {
        uVar15 = uVar25;
      }
      for (; uVar15 != uVar25; uVar25 = uVar25 + 1) {
        PrintFunction(f->p[uVar25],full);
      }
      return;
    }
    uVar10 = 0xffffffff;
    if (f->lineinfo != (int *)0x0) {
      uVar10 = f->lineinfo[iVar11];
    }
    uVar24 = pIVar5[iVar11];
    iVar16 = iVar11 + 1;
    printf("\t%d\t");
    if ((int)uVar10 < 1) {
      printf("[-]\t");
    }
    else {
      printf("[%d]\t",(ulong)uVar10);
    }
    uVar23 = uVar24 & 0x3f;
    uVar22 = uVar24 >> 6;
    uVar15 = (ulong)(uVar22 & 0xff);
    uVar9 = uVar24 >> 0x17;
    i = uVar24 >> 0xe;
    uVar10 = i & 0x1ff;
    printf("%-9s\t",luaP_opnames[uVar23]);
    bVar2 = luaP_opmodes[uVar23];
    switch(bVar2 & 3) {
    case 0:
      printf("%d",uVar15);
      if ((bVar2 & 0x30) != 0) {
        uVar17 = ~uVar9 | 0xffffff00;
        if (-1 < (int)uVar24) {
          uVar17 = uVar9;
        }
        printf(" %d",(ulong)uVar17);
      }
      if ((bVar2 & 0xc) != 0) {
        uVar17 = ~i | 0xffffff00;
        if ((uVar24 >> 0x16 & 1) == 0) {
          uVar17 = uVar10;
        }
LAB_00104b19:
        pcVar13 = " %d";
        goto LAB_00104b22;
      }
      break;
    case 1:
      printf("%d",uVar15);
      if ((bVar2 & 0x30) == 0x10) {
        printf(" %d",(ulong)i);
      }
      else {
        uVar17 = ~i;
        if ((bVar2 & 0x30) == 0x30) goto LAB_00104b19;
      }
      break;
    case 2:
      printf("%d %d",uVar15,(ulong)(i - 0x1ffff));
      break;
    case 3:
      uVar17 = ~uVar22;
      pcVar13 = "%d";
LAB_00104b22:
      printf(pcVar13,(ulong)uVar17);
    }
    switch(uVar23) {
    case 1:
      printf("\t; ");
      goto LAB_00104d28;
    case 5:
    case 9:
      lVar21 = *(long *)((long)&f->upvalues->name + (ulong)(uVar9 << 4));
      pcVar13 = "-";
      if (lVar21 != 0) {
        pcVar13 = (char *)(lVar21 + 0x18);
      }
      pcVar18 = "\t; %s";
      goto LAB_00104c40;
    case 6:
      lVar21 = *(long *)((long)&f->upvalues->name + (ulong)(uVar9 << 4));
      pcVar13 = (char *)(lVar21 + 0x18);
      if (lVar21 == 0) {
        pcVar13 = "-";
      }
      printf("\t; %s",pcVar13);
      goto LAB_00104d11;
    case 7:
    case 0xc:
      if ((uVar24 >> 0x16 & 1) == 0) break;
      printf("\t; ");
      goto LAB_00104d20;
    case 8:
      lVar21 = *(long *)((long)&f->upvalues->name + (ulong)((uVar22 & 0xff) << 4));
      pcVar13 = "-";
      if (lVar21 != 0) {
        pcVar13 = (char *)(lVar21 + 0x18);
      }
      printf("\t; %s",pcVar13);
      if ((int)uVar24 < 0) {
        putchar(0x20);
        PrintConstant(f,uVar9 & 0xff);
      }
LAB_00104d11:
      if ((uVar24 >> 0x16 & 1) != 0) {
        putchar(0x20);
LAB_00104d20:
        i = i & 0xff;
        goto LAB_00104d28;
      }
      break;
    case 10:
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x1f:
    case 0x20:
    case 0x21:
      if ((uVar24 & 0x80400000) != 0) {
        printf("\t; ");
        if ((int)uVar24 < 0) {
          PrintConstant(f,uVar9 & 0xff);
        }
        else {
          putchar(0x2d);
        }
        putchar(0x20);
        if ((uVar24 >> 0x16 & 1) != 0) goto LAB_00104d20;
        putchar(0x2d);
      }
      break;
    case 0x1e:
    case 0x27:
    case 0x28:
    case 0x2a:
      uVar10 = iVar11 + (i - 0x1ffff) + 2;
      pcVar13 = "\t; to %d";
LAB_00104b8c:
      printf(pcVar13,(ulong)uVar10);
      break;
    case 0x2b:
      if (uVar10 != 0) {
        pcVar13 = "\t; %d";
        goto LAB_00104b8c;
      }
      printf("\t; %d",(ulong)pIVar5[iVar16]);
      iVar16 = iVar11 + 2;
      goto LAB_00104d31;
    case 0x2c:
      pcVar13 = (char *)f->p[i];
      pcVar18 = "\t; %p";
LAB_00104c40:
      printf(pcVar18,pcVar13);
      break;
    case 0x2e:
      printf("\t; ");
      i = uVar22;
LAB_00104d28:
      PrintConstant(f,i);
    }
LAB_00104d31:
    putchar(10);
    iVar11 = iVar16;
  } while( true );
}

Assistant:

static void PrintFunction(const Proto *f, int full) {
    int i, n = f->sizep;
    PrintHeader(f);
    PrintCode(f);
    if (full) PrintDebug(f);
    for (i = 0; i < n; i++) PrintFunction(f->p[i], full);
}